

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_replace_plugin(_func_void *oldplugin,_func_void *newplugin)

{
  fsnav_plugin *pfVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  
  if ((fsnav->core).plugin_count != 0) {
    lVar3 = 0;
    cVar2 = '\0';
    uVar4 = 0;
    do {
      pfVar1 = (fsnav->core).plugins;
      if (*(_func_void **)((long)&pfVar1->func + lVar3) == oldplugin) {
        *(_func_void **)((long)&pfVar1->func + lVar3) = newplugin;
        cVar2 = '\x01';
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < (fsnav->core).plugin_count);
    return cVar2;
  }
  return '\0';
}

Assistant:

char fsnav_replace_plugin(void(*oldplugin)(void), void(*newplugin)(void))
{
	size_t i;
	char flag;

	for (i = 0, flag = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func != oldplugin)
			continue;
		fsnav->core.plugins[i].func = newplugin;
		flag = 1;
	}

	return flag;
}